

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_compareNodesEqual(PyObject *self,PyObject *args)

{
  int iVar1;
  xmlChar *local_50;
  xmlChar *local_48;
  xmlNodePtr node2;
  xmlNodePtr node1;
  PyObject *py_node2;
  PyObject *py_node1;
  PyObject *args_local;
  PyObject *self_local;
  
  py_node1 = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"OO:compareNodesEqual",&py_node2,&node1);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (py_node2 == (PyObject *)&_Py_NoneStruct) {
      local_48 = (xmlChar *)0x0;
    }
    else {
      local_48 = (xmlChar *)py_node2[1].ob_refcnt;
    }
    if (node1 == (xmlNodePtr)&_Py_NoneStruct) {
      local_50 = (xmlChar *)0x0;
    }
    else {
      local_50 = node1->name;
    }
    if (local_48 == local_50) {
      self_local = (PyObject *)_Py_BuildValue_SizeT("i",1);
    }
    else {
      self_local = (PyObject *)_Py_BuildValue_SizeT("i",0);
    }
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_compareNodesEqual(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    
    PyObject *py_node1, *py_node2;
    xmlNodePtr node1, node2;

    if (!PyArg_ParseTuple(args, (char *)"OO:compareNodesEqual",
		&py_node1, &py_node2))
        return NULL;
    /* To compare two node objects, we compare their pointer addresses */
    node1 = PyxmlNode_Get(py_node1);
    node2 = PyxmlNode_Get(py_node2);
    if ( node1 == node2 )
        return Py_BuildValue((char *)"i", 1);
    else
        return Py_BuildValue((char *)"i", 0);
    
}